

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::filesystem_error::~filesystem_error(filesystem_error *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__filesystem_error_002935f0;
  pcVar1 = (this->_p2)._path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_p2)._path.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_p1)._path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_p1)._path.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_what_arg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_what_arg).field_2) {
    operator_delete(pcVar1);
  }
  std::system_error::~system_error(&this->super_system_error);
  return;
}

Assistant:

class GHC_FS_API_CLASS filesystem_error : public std::system_error
{
public:
    filesystem_error(const std::string& what_arg, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, std::error_code ec);
    filesystem_error(const std::string& what_arg, const path& p1, const path& p2, std::error_code ec);
    const path& path1() const noexcept;
    const path& path2() const noexcept;
    const char* what() const noexcept override;

private:
    std::string _what_arg;
    std::error_code _ec;
    path _p1, _p2;
}